

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O0

void trt_pose::parse::munkresStep1
               (float *cost_graph,int M,PairGraph *star_graph,int nrows,int ncols)

{
  bool bVar1;
  int local_30;
  int local_2c;
  int j;
  int i;
  int ncols_local;
  int nrows_local;
  PairGraph *star_graph_local;
  int M_local;
  float *cost_graph_local;
  
  for (local_2c = 0; local_2c < nrows; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < ncols; local_30 = local_30 + 1) {
      bVar1 = utils::PairGraph::isRowSet(star_graph,local_2c);
      if (!bVar1) {
        bVar1 = utils::PairGraph::isColSet(star_graph,local_30);
        if (!bVar1) {
          if ((cost_graph[local_2c * M + local_30] == 0.0) &&
             (!NAN(cost_graph[local_2c * M + local_30]))) {
            utils::PairGraph::set(star_graph,local_2c,local_30);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void munkresStep1(const float *cost_graph, const int M, PairGraph &star_graph,
                  const int nrows, const int ncols) {
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (!star_graph.isRowSet(i) && !star_graph.isColSet(j) &&
          (cost_graph[i * M + j] == 0)) {
        star_graph.set(i, j);
      }
    }
  }
}